

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::_::FiberStack::runOne(FiberStack *this)

{
  uint uVar1;
  FunctionParam<void_()> *in_RDX;
  Exception *exception;
  NullableValue<kj::Exception> _exception1534;
  NullableValue<kj::Exception> local_340;
  NullableValue<kj::Exception> local_1a8;
  
  uVar1 = (this->main).tag;
  if (uVar1 == 2) {
    runCatchingExceptions<kj::FunctionParam<void()>&>
              ((Maybe<kj::Exception> *)&local_1a8,*(kj **)(this->main).field_1,in_RDX);
    NullableValue<kj::Exception>::NullableValue(&local_340,&local_1a8);
    NullableValue<kj::Exception>::~NullableValue(&local_1a8);
    if (local_340.isSet == true) {
      NullableValue<kj::Exception>::emplace<kj::Exception>
                ((NullableValue<kj::Exception> *)((long)(this->main).field_1 + 8),
                 &local_340.field_1.value);
    }
    NullableValue<kj::Exception>::~NullableValue(&local_340);
  }
  else if (uVar1 == 1) {
    FiberBase::run((FiberBase *)(this->main).field_1);
    return;
  }
  return;
}

Assistant:

void FiberStack::runOne() {
  KJ_SWITCH_ONEOF(main) {
    KJ_CASE_ONEOF(event, FiberBase*) {
      event->run();
    }
    KJ_CASE_ONEOF(func, SynchronousFunc*) {
      KJ_IF_SOME(exception, kj::runCatchingExceptions(func->func)) {
        func->exception.emplace(kj::mv(exception));
      }
    }
  }
}